

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

int mpz_cmp_d(__mpz_struct *x,double d)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  if (x->_mp_size < 0) {
    iVar4 = -1;
    if (d < 0.0) {
      iVar4 = mpz_cmpabs_d(x,d);
      return -iVar4;
    }
  }
  else {
    iVar4 = 1;
    if (0.0 <= d) {
      uVar1 = x->_mp_size;
      uVar7 = -(ulong)(-d <= d);
      dVar8 = (double)(~uVar7 & (ulong)-d | (ulong)d & uVar7);
      if (uVar1 != 0) {
        uVar2 = -uVar1;
        if (0 < (int)uVar1) {
          uVar2 = uVar1;
        }
        uVar7 = (ulong)uVar2;
        if (1 < uVar2) {
          lVar5 = uVar7 - 1;
          do {
            dVar8 = dVar8 * 5.421010862427522e-20;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        iVar4 = -1;
        if (dVar8 < 1.8446744073709552e+19) {
          do {
            if ((long)uVar7 < 1) goto LAB_00102a60;
            uVar6 = (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f | (long)dVar8;
            if (uVar6 < x->_mp_d[uVar7 - 1]) {
              iVar4 = 1;
LAB_00102a2f:
              bVar3 = false;
            }
            else {
              if (x->_mp_d[uVar7 - 1] < uVar6) {
                iVar4 = -1;
                goto LAB_00102a2f;
              }
              auVar9._8_4_ = (int)(uVar6 >> 0x20);
              auVar9._0_8_ = uVar6;
              auVar9._12_4_ = 0x45300000;
              dVar8 = (dVar8 - ((auVar9._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0))) *
                      1.8446744073709552e+19;
              bVar3 = true;
            }
            uVar7 = uVar7 - 1;
          } while (bVar3);
        }
        return iVar4;
      }
LAB_00102a60:
      return -(uint)(0.0 < dVar8);
    }
  }
  return iVar4;
}

Assistant:

int
mpz_cmp_d (const mpz_t x, double d)
{
  if (x->_mp_size < 0)
    {
      if (d >= 0.0)
	return -1;
      else
	return -mpz_cmpabs_d (x, d);
    }
  else
    {
      if (d < 0.0)
	return 1;
      else
	return mpz_cmpabs_d (x, d);
    }
}